

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_name(StringRef path,Style style)

{
  size_t *this;
  char cVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  Style in_R8D;
  bool bVar6;
  StringRef Suffix;
  StringRef SVar7;
  StringRef path_00;
  undefined1 local_58 [8];
  const_iterator b;
  
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)path.Length;
  path_00.Length._4_4_ = 0;
  begin((const_iterator *)local_58,(path *)path.Data,path_00,in_R8D);
  if (local_58 == (undefined1  [8])path.Data) {
    pcVar4 = (char *)0x0;
    pcVar5 = (char *)0x0;
    if (b.Component.Length == path.Length) goto LAB_00dbdea9;
  }
  this = &b.Path.Length;
  if (b.Component.Data < (char *)0x3) {
LAB_00dbde74:
    bVar6 = false;
  }
  else {
    cVar1 = StringRef::operator[]((StringRef *)this,0);
    if ((cVar1 != '/') && (cVar1 != '\\' || style != windows)) goto LAB_00dbde74;
    cVar1 = StringRef::operator[]((StringRef *)this,1);
    cVar2 = StringRef::operator[]((StringRef *)this,0);
    bVar6 = cVar1 == cVar2;
  }
  if (style == windows) {
    Suffix.Length = 1;
    Suffix.Data = ":";
    bVar3 = StringRef::endswith((StringRef *)this,Suffix);
  }
  else {
    bVar3 = false;
  }
  pcVar4 = (char *)0x0;
  pcVar5 = (char *)0x0;
  if ((bVar6 | bVar3) == 1) {
    pcVar4 = (char *)b.Path.Length;
    pcVar5 = b.Component.Data;
  }
LAB_00dbdea9:
  SVar7.Length = (size_t)pcVar5;
  SVar7.Data = pcVar4;
  return SVar7;
}

Assistant:

StringRef root_name(StringRef path, Style style) {
  const_iterator b = begin(path, style), e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      // just {C:,//net}, return the first component.
      return *b;
    }
  }

  // No path or no name.
  return StringRef();
}